

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,bool build,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  cmValue c2;
  size_type *psVar4;
  undefined7 in_register_00000011;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string gbuild;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tsp;
  string local_e0;
  string local_c0;
  undefined8 local_a0;
  char *local_98;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000011,build) == 0) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    GetToolset(this,mf,&local_70,ts);
    if (local_70._M_string_length == 0) {
      bVar2 = false;
    }
    else {
      paVar1 = &local_c0.field_2;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::string::append((char *)&local_c0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_e0.field_2._M_allocated_capacity = *psVar4;
        local_e0.field_2._8_8_ = plVar3[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar4;
        local_e0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_e0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CMAKE_MAKE_PROGRAM","");
      c2 = cmMakefile::GetDefinition(mf,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (((c2.Value == (string *)0x0) || ((c2.Value)->_M_string_length == 0)) ||
         (bVar2 = cmsys::SystemTools::ComparePath(&local_e0,c2.Value), bVar2)) {
        local_c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CMAKE_MAKE_PROGRAM","")
        ;
        cmMakefile::AddCacheDefinition
                  (mf,&local_c0,local_e0._M_dataplus._M_p,"build program to use",INTERNAL,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        local_c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"CMAKE_SYSTEM_VERSION","");
        value._M_str = local_70._M_dataplus._M_p;
        value._M_len = local_70._M_string_length;
        cmMakefile::AddDefinition(mf,&local_c0,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar2 = true;
      }
      else {
        local_c0._M_dataplus._M_p = &DAT_00000014;
        local_c0._M_string_length = 0x707538;
        local_c0.field_2._M_allocated_capacity = local_e0._M_string_length;
        local_c0.field_2._8_8_ = local_e0._M_dataplus._M_p;
        local_a0 = 0x30;
        local_98 = "\nDoes not match the previously used build tool: ";
        local_88 = ((c2.Value)->_M_dataplus)._M_p;
        local_90 = (c2.Value)->_M_string_length;
        local_80 = 0x67;
        local_78 = 
        "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
        ;
        views._M_len = 5;
        views._M_array = (iterator)&local_c0;
        cmCatViews_abi_cxx11_(&local_50,views);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    bool build, cmMakefile* mf)
{
  /* In build mode nothing to be done.
   * Toolset already determined and build tool absolute path is cached.
   */
  if (build) {
    return true;
  }

  /* Determine the absolute directory for the toolset */
  std::string tsp;
  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  cmValue prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (cmNonempty(prevTool) && !cmSystemTools::ComparePath(gbuild, prevTool)) {
    std::string const& e =
      cmStrCat("toolset build tool: ", gbuild,
               "\nDoes not match the previously used build tool: ", prevTool,
               "\nEither remove the CMakeCache.txt file and CMakeFiles "
               "directory or choose a different binary directory.");
    mf->IssueMessage(MessageType::FATAL_ERROR, e);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild, "build program to use",
                         cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp);

  return true;
}